

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkContext.h
# Opt level: O3

bool __thiscall Memory::MarkContext::IsEmpty(MarkContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PagePool *pPVar4;
  
  bVar2 = PageStack<Memory::MarkContext::MarkCandidate>::IsEmpty(&this->markStack);
  if ((!bVar2) || (bVar2 = PageStack<FinalizableObject_*>::IsEmpty(&this->trackStack), !bVar2)) {
    return false;
  }
  pPVar4 = this->pagePool;
  if (pPVar4->freePageList != (PagePoolFreePage *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.h"
                       ,0x59,"(pagePool->IsEmpty())","pagePool->IsEmpty()");
    if (!bVar2) goto LAB_0071ab96;
    *puVar3 = 0;
    pPVar4 = this->pagePool;
  }
  if ((pPVar4->pageAllocator).disableAllocationOutOfMemory != true) {
    return true;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.h"
                     ,0x5a,"(!GetPageAllocator()->DisableAllocationOutOfMemory())",
                     "!GetPageAllocator()->DisableAllocationOutOfMemory()");
  if (bVar2) {
    *puVar3 = 0;
    return true;
  }
LAB_0071ab96:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool IsEmpty()
    {
        if (HasPendingObjects())
        {
            return false;
        }

        Assert(pagePool->IsEmpty());
        Assert(!GetPageAllocator()->DisableAllocationOutOfMemory());
        return true;
    }